

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_sse2.c
# Opt level: O0

void aom_highbd_filter_block1d4_h4_sse2
               (uint16_t *src_ptr,ptrdiff_t src_pitch,uint16_t *dst_ptr,ptrdiff_t dst_pitch,
               uint32_t height,int16_t *filter,int bd)

{
  undefined1 auVar1 [12];
  undefined1 auVar2 [12];
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  short sVar8;
  undefined1 (*pauVar9) [16];
  long in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  undefined8 *in_R9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined4 uVar13;
  undefined1 auVar12 [16];
  __m128i max;
  uint i;
  __m128i srcReg32b1;
  __m128i srcRegFilt32b1_1;
  __m128i thirdFilters;
  __m128i secondFilters;
  __m128i addFilterReg64;
  __m128i filtersReg;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  int local_2ec;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2b8;
  undefined8 *local_270;
  long local_260;
  undefined4 local_238;
  undefined4 uStack_234;
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 local_218;
  undefined4 uStack_214;
  undefined4 local_208;
  undefined4 uStack_204;
  undefined4 uStack_1cc;
  undefined4 uStack_1c0;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  int local_118;
  int iStack_114;
  int iStack_110;
  int iStack_10c;
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  short local_a8;
  short sStack_a6;
  short sStack_a4;
  short sStack_a2;
  __m128i ss_45;
  __m128i ss_23;
  __m128i ss_5_1;
  __m128i ss_4_1;
  __m128i ss_3_1;
  __m128i tmp_1;
  __m128i tmp_0;
  
  local_260 = in_RDI + -6;
  uVar3 = in_R9[1];
  sVar8 = (short)(1 << ((byte)max[1] & 0x1f)) + -1;
  uVar13 = (undefined4)((ulong)*in_R9 >> 0x20);
  uStack_1c0 = (undefined4)uVar3;
  uStack_1cc = (undefined4)((ulong)uVar3 >> 0x20);
  auVar1._4_8_ = uVar3;
  auVar1._0_4_ = uVar13;
  auVar10._0_8_ = auVar1._0_8_ << 0x20;
  auVar10._8_4_ = uStack_1c0;
  auVar10._12_4_ = uStack_1cc;
  uStack_1b4 = (undefined4)*in_R9;
  auVar2._4_8_ = auVar10._8_8_;
  auVar2._0_4_ = uStack_1b4;
  auVar12._0_8_ = auVar2._0_8_ << 0x20;
  auVar12._8_4_ = uStack_1b0;
  auVar12._12_4_ = uVar13;
  local_270 = in_RDX;
  for (local_2ec = in_R8D; local_2ec != 0; local_2ec = local_2ec + -1) {
    pauVar9 = (undefined1 (*) [16])(local_260 + 4);
    local_208 = (undefined4)*(undefined8 *)*pauVar9;
    uStack_204 = (undefined4)((ulong)*(undefined8 *)*pauVar9 >> 0x20);
    local_218 = SUB164(*pauVar9,2);
    uStack_214 = SUB164(*pauVar9,6);
    local_368 = CONCAT44(local_218,local_208);
    uStack_360._0_4_ = uStack_204;
    uStack_360._4_4_ = uStack_214;
    local_228 = SUB164(*pauVar9,4);
    uStack_224 = SUB164(*pauVar9,8);
    local_238 = SUB164(*pauVar9,6);
    uStack_234 = SUB164(*pauVar9,10);
    local_378 = CONCAT44(local_238,local_228);
    uStack_370._0_4_ = uStack_224;
    uStack_370._4_4_ = uStack_234;
    auVar6._8_8_ = uStack_360;
    auVar6._0_8_ = local_368;
    auVar5._8_8_ = auVar12._8_8_;
    auVar5._0_8_ = local_2b8;
    auVar10 = pmaddwd(auVar6,auVar5);
    auVar4._8_8_ = uStack_370;
    auVar4._0_8_ = local_378;
    auVar11._8_8_ = CONCAT44(uStack_1c0,uStack_1c0);
    auVar11._0_8_ = CONCAT44(uStack_1c0,uStack_1c0);
    auVar11 = pmaddwd(auVar4,auVar11);
    local_108 = auVar10._0_4_;
    iStack_104 = auVar10._4_4_;
    iStack_100 = auVar10._8_4_;
    iStack_fc = auVar10._12_4_;
    local_118 = auVar11._0_4_;
    iStack_114 = auVar11._4_4_;
    iStack_110 = auVar11._8_4_;
    iStack_10c = auVar11._12_4_;
    auVar10 = ZEXT416(7);
    local_2d8 = CONCAT44(iStack_104 + iStack_114 + 0x40 >> auVar10,
                         local_108 + local_118 + 0x40 >> auVar10);
    uStack_2d0._0_4_ = iStack_100 + iStack_110 + 0x40 >> auVar10;
    uStack_2d0._4_4_ = iStack_fc + iStack_10c + 0x40 >> auVar10;
    auVar7._8_8_ = uStack_2d0;
    auVar7._0_8_ = local_2d8;
    auVar10 = packssdw(auVar7,ZEXT816(0));
    local_a8 = auVar10._0_2_;
    sStack_a6 = auVar10._2_2_;
    sStack_a4 = auVar10._4_2_;
    sStack_a2 = auVar10._6_2_;
    local_a8 = (ushort)(-1 < local_a8) * local_a8;
    sStack_a6 = (ushort)(-1 < sStack_a6) * sStack_a6;
    sStack_a4 = (ushort)(-1 < sStack_a4) * sStack_a4;
    sStack_a2 = (ushort)(-1 < sStack_a2) * sStack_a2;
    local_2d8 = CONCAT26((ushort)(sVar8 < sStack_a2) * sVar8 |
                         (ushort)(sVar8 >= sStack_a2) * sStack_a2,
                         CONCAT24((ushort)(sVar8 < sStack_a4) * sVar8 |
                                  (ushort)(sVar8 >= sStack_a4) * sStack_a4,
                                  CONCAT22((ushort)(sVar8 < sStack_a6) * sVar8 |
                                           (ushort)(sVar8 >= sStack_a6) * sStack_a6,
                                           (ushort)(sVar8 < local_a8) * sVar8 |
                                           (ushort)(sVar8 >= local_a8) * local_a8)));
    local_260 = local_260 + in_RSI * 2;
    *local_270 = local_2d8;
    local_270 = (undefined8 *)(in_RCX * 2 + (long)local_270);
  }
  return;
}

Assistant:

static void aom_highbd_filter_block1d4_h4_sse2(
    const uint16_t *src_ptr, ptrdiff_t src_pitch, uint16_t *dst_ptr,
    ptrdiff_t dst_pitch, uint32_t height, const int16_t *filter, int bd) {
  __m128i filtersReg;
  __m128i addFilterReg64;
  __m128i secondFilters, thirdFilters;
  __m128i srcRegFilt32b1_1;
  __m128i srcReg32b1;
  unsigned int i;
  src_ptr -= 3;
  addFilterReg64 = _mm_set1_epi32(64);
  filtersReg = _mm_loadu_si128((const __m128i *)filter);
  const __m128i max = _mm_set1_epi16((1 << bd) - 1);

  // coeffs 0 1 0 1 2 3 2 3
  const __m128i tmp_0 = _mm_unpacklo_epi32(filtersReg, filtersReg);
  // coeffs 4 5 4 5 6 7 6 7
  const __m128i tmp_1 = _mm_unpackhi_epi32(filtersReg, filtersReg);

  secondFilters = _mm_unpackhi_epi64(tmp_0, tmp_0);  // coeffs 2 3 2 3 2 3 2 3
  thirdFilters = _mm_unpacklo_epi64(tmp_1, tmp_1);   // coeffs 4 5 4 5 4 5 4 5

  for (i = height; i > 0; i -= 1) {
    srcReg32b1 = _mm_loadu_si128((const __m128i *)(src_ptr + 2));

    __m128i ss_3_1 = _mm_srli_si128(srcReg32b1, 2);
    __m128i ss_4_1 = _mm_srli_si128(srcReg32b1, 4);
    __m128i ss_5_1 = _mm_srli_si128(srcReg32b1, 6);
    __m128i ss_23 = _mm_unpacklo_epi32(srcReg32b1, ss_3_1);
    __m128i ss_45 = _mm_unpacklo_epi32(ss_4_1, ss_5_1);

    ss_23 = _mm_madd_epi16(ss_23, secondFilters);
    ss_45 = _mm_madd_epi16(ss_45, thirdFilters);
    srcRegFilt32b1_1 = _mm_add_epi32(ss_23, ss_45);

    // shift by 7 bit each 32 bit
    srcRegFilt32b1_1 = _mm_add_epi32(srcRegFilt32b1_1, addFilterReg64);
    srcRegFilt32b1_1 = _mm_srai_epi32(srcRegFilt32b1_1, 7);

    srcRegFilt32b1_1 = _mm_packs_epi32(srcRegFilt32b1_1, _mm_setzero_si128());
    srcRegFilt32b1_1 = _mm_max_epi16(srcRegFilt32b1_1, _mm_setzero_si128());
    srcRegFilt32b1_1 = _mm_min_epi16(srcRegFilt32b1_1, max);

    src_ptr += src_pitch;

    _mm_storel_epi64((__m128i *)dst_ptr, srcRegFilt32b1_1);

    dst_ptr += dst_pitch;
  }
}